

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerator.cpp
# Opt level: O2

void __thiscall SignalGenerator::SignalGenerator(SignalGenerator *this,SignalGenerator_param *param)

{
  double dVar1;
  Clock *pCVar2;
  Logging *pLVar3;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_00112be8;
  this->param = param;
  (this->generator)._M_x = 1;
  *(undefined4 *)&(this->distribution)._M_param._M_mean = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_mean + 4) = 0;
  *(undefined4 *)&(this->distribution)._M_param._M_stddev = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_stddev + 4) = 0x3ff00000;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  pCVar2 = Clock::getInstance();
  this->clock = pCVar2;
  pLVar3 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar3;
  std::chrono::_V2::system_clock::now();
  (this->generator)._M_x = 1;
  dVar1 = param->noiseStd;
  (this->distribution)._M_param._M_mean = param->noiseMean;
  (this->distribution)._M_param._M_stddev = dVar1;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  return;
}

Assistant:

SignalGenerator::SignalGenerator(SignalGenerator_param* param) : param(param) {
    clock = Clock::getInstance();
    initialize();
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    generator = std::default_random_engine(0);
    distribution = std::normal_distribution<double>(param->noiseMean, param->noiseStd);
}